

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

Id __thiscall spv::Builder::getImageType(Builder *this,Id resultId)

{
  bool bVar1;
  Instruction *this_00;
  Id local_2c;
  bool local_19;
  Id typeId;
  Id resultId_local;
  Builder *this_local;
  
  local_2c = getTypeId(this,resultId);
  bVar1 = isImageType(this,local_2c);
  local_19 = true;
  if (!bVar1) {
    local_19 = isSampledImageType(this,local_2c);
  }
  if (local_19 != false) {
    bVar1 = isSampledImageType(this,local_2c);
    if (bVar1) {
      this_00 = Module::getInstruction(&this->module,local_2c);
      local_2c = spv::Instruction::getIdOperand(this_00,0);
    }
    return local_2c;
  }
  __assert_fail("isImageType(typeId) || isSampledImageType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                ,0x172,"Id spv::Builder::getImageType(Id) const");
}

Assistant:

Id getImageType(Id resultId) const
    {
        Id typeId = getTypeId(resultId);
        assert(isImageType(typeId) || isSampledImageType(typeId));
        return isSampledImageType(typeId) ? module.getInstruction(typeId)->getIdOperand(0) : typeId;
    }